

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O1

Gia_Man_t *
Bmc_GiaGenerateGiaAllOne(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int iVar7;
  Vec_Bit_t *pVVar8;
  int *__s;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  uint uVar13;
  int iVar14;
  Vec_Int_t *pVVar15;
  char *pcVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  char *__assertion;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  
  Gia_ManCleanMark0(p);
  uVar13 = p->nRegs;
  if ((int)uVar13 < 1) {
    uVar23 = 0;
  }
  else {
    uVar25 = 0;
    do {
      iVar27 = p->vCis->nSize;
      uVar23 = (uint)uVar25;
      uVar21 = (iVar27 - uVar13) + uVar23;
      if (((int)uVar21 < 0) || (iVar27 <= (int)uVar21)) goto LAB_00576e64;
      iVar27 = p->vCis->pArray[uVar21];
      lVar22 = (long)iVar27;
      if ((lVar22 < 0) || (p->nObjs <= iVar27)) goto LAB_00576e45;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar23 = uVar23 + 1;
      *(ulong *)(pGVar4 + lVar22) =
           *(ulong *)(pGVar4 + lVar22) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar25 >> 5] >> ((byte)uVar25 & 0x1f) & 1) << 0x1e);
      uVar13 = p->nRegs;
      uVar25 = (ulong)uVar23;
    } while ((int)uVar23 < (int)uVar13);
  }
  iVar27 = (((int)uVar13 >> 5) + 1) - (uint)((uVar13 & 0x1f) == 0);
  pVVar8 = (Vec_Bit_t *)malloc(0x10);
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar27 * 0x20;
  if (iVar27 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar27 * 4);
  }
  pVVar8->pArray = __s;
  pVVar8->nSize = iVar27 * 0x20;
  memset(__s,0,(long)iVar27 << 2);
  *pvInits = pVVar8;
  if (iFrEnd < 1) {
    iVar27 = 0;
  }
  else {
    iVar7 = 0;
    do {
      if ((iVar7 == iFrBeg) && (iVar27 = p->nRegs, 0 < iVar27)) {
        pVVar15 = p->vCis;
        uVar13 = 0;
        do {
          iVar14 = pVVar15->nSize;
          uVar21 = (iVar14 - iVar27) + uVar13;
          if (((int)uVar21 < 0) || (iVar14 <= (int)uVar21)) goto LAB_00576e64;
          iVar27 = pVVar15->pArray[uVar21];
          if (((long)iVar27 < 0) || (p->nObjs <= iVar27)) goto LAB_00576e45;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if ((p->pObjs[iVar27].field_0x3 & 0x40) != 0) {
            if ((*pvInits)->nSize <= (int)uVar13) {
              __assertion = "i >= 0 && i < p->nSize";
              pcVar10 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
              ;
              pcVar16 = "void Vec_BitWriteEntry(Vec_Bit_t *, int, int)";
              goto LAB_00576eb7;
            }
            puVar1 = (uint *)((*pvInits)->pArray + (uVar13 >> 5));
            *puVar1 = *puVar1 | 1 << ((byte)uVar13 & 0x1f);
          }
          uVar13 = uVar13 + 1;
          iVar27 = p->nRegs;
        } while ((int)uVar13 < iVar27);
      }
      pVVar15 = p->vCis;
      uVar25 = (ulong)(uint)pVVar15->nSize;
      if (p->nRegs < pVVar15->nSize) {
        lVar22 = 0;
        do {
          if ((int)uVar25 <= lVar22) goto LAB_00576e64;
          lVar26 = (long)pVVar15->pArray[lVar22];
          if ((lVar26 < 0) || (p->nObjs <= pVVar15->pArray[lVar22])) goto LAB_00576e45;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar4 + lVar26) =
               *(ulong *)(pGVar4 + lVar26) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)uVar23 + lVar22) >> 5] >>
                        ((byte)((ulong)uVar23 + lVar22) & 0x1f) & 1) << 0x1e);
          lVar22 = lVar22 + 1;
          pVVar15 = p->vCis;
          uVar25 = (ulong)pVVar15->nSize;
        } while (lVar22 < (long)(uVar25 - (long)p->nRegs));
        uVar23 = uVar23 + (int)lVar22;
      }
      if (0 < p->nObjs) {
        lVar22 = 0;
        lVar26 = 0;
        do {
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar25 = *(ulong *)(&pGVar4->field_0x0 + lVar22);
          if ((uVar25 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar25) {
            *(ulong *)(&pGVar4->field_0x0 + lVar22) =
                 uVar25 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar25 >> 0x3d) ^
                          *(uint *)((long)pGVar4 +
                                   (ulong)((uint)(uVar25 >> 0x1e) & 0x7ffffffc) * -3 + lVar22) >>
                          0x1e) & ((uint)(uVar25 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar4 +
                                           (ulong)(uint)((int)(uVar25 & 0x1fffffff) << 2) * -3 +
                                           lVar22) >> 0x1e) & 1) << 0x1e);
          }
          lVar26 = lVar26 + 1;
          lVar22 = lVar22 + 0xc;
        } while (lVar26 < p->nObjs);
      }
      pVVar15 = p->vCos;
      if (0 < pVVar15->nSize) {
        lVar22 = 0;
        do {
          iVar27 = pVVar15->pArray[lVar22];
          if (((long)iVar27 < 0) || (p->nObjs <= iVar27)) goto LAB_00576e45;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar27;
          uVar13 = (uint)*(ulong *)pGVar4;
          *(ulong *)pGVar4 =
               *(ulong *)pGVar4 & 0xffffffffbfffffff |
               (ulong)((uVar13 * 2 ^ *(uint *)(pGVar4 + -(ulong)(uVar13 & 0x1fffffff))) & 0x40000000
                      );
          lVar22 = lVar22 + 1;
          pVVar15 = p->vCos;
        } while (lVar22 < pVVar15->nSize);
      }
      iVar27 = p->nRegs;
      if (0 < iVar27) {
        iVar14 = 0;
        do {
          iVar2 = p->vCos->nSize;
          uVar13 = (iVar2 - iVar27) + iVar14;
          if (((int)uVar13 < 0) || (iVar2 <= (int)uVar13)) goto LAB_00576e64;
          iVar2 = p->vCos->pArray[uVar13];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00576e45;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          iVar3 = p->vCis->nSize;
          uVar13 = (iVar3 - iVar27) + iVar14;
          if (((int)uVar13 < 0) || (iVar3 <= (int)uVar13)) goto LAB_00576e64;
          iVar27 = p->vCis->pArray[uVar13];
          lVar22 = (long)iVar27;
          if ((lVar22 < 0) || (p->nObjs <= iVar27)) goto LAB_00576e45;
          *(ulong *)(pGVar4 + lVar22) =
               *(ulong *)(pGVar4 + lVar22) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar4 + iVar2) & 0x40000000);
          iVar14 = iVar14 + 1;
          iVar27 = p->nRegs;
        } while (iVar14 < iVar27);
      }
      iVar7 = iVar7 + 1;
      iVar27 = iFrEnd;
    } while (iVar7 != iFrEnd);
  }
  if (iVar27 != iFrEnd) {
    __assert_fail("i == iFrEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                  ,0x18a,
                  "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                 );
  }
  p_00 = Gia_ManStart(10000);
  pcVar16 = p->pName;
  if (pcVar16 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar16);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar16);
  }
  p_00->pName = pcVar10;
  pGVar4 = p->pObjs;
  pGVar4->Value = 1;
  pVVar15 = p->vCis;
  uVar13 = pVVar15->nSize;
  uVar21 = uVar13 - p->nRegs;
  if (uVar21 != 0 && p->nRegs <= (int)uVar13) {
    uVar20 = 0;
    uVar25 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar25 = uVar20;
    }
    do {
      if (uVar25 == uVar20) goto LAB_00576e64;
      iVar27 = pVVar15->pArray[uVar20];
      if (((long)iVar27 < 0) || (p->nObjs <= iVar27)) goto LAB_00576e45;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar4[iVar27].Value = 1;
      uVar20 = uVar20 + 1;
    } while (uVar21 != uVar20);
  }
  iVar27 = p->nRegs;
  if (0 < iVar27) {
    iVar7 = 0;
    do {
      iVar14 = p->vCis->nSize;
      uVar13 = (iVar14 - iVar27) + iVar7;
      if (((int)uVar13 < 0) || (iVar14 <= (int)uVar13)) goto LAB_00576e64;
      iVar27 = p->vCis->pArray[uVar13];
      if (((long)iVar27 < 0) || (p->nObjs <= iVar27)) goto LAB_00576e45;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar25 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar25 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar25 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) {
LAB_00576ee0:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_00576ee0;
      uVar13 = (int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * 0x55555556;
      if ((int)uVar13 < 0) {
        __assertion = "Lit >= 0";
        pcVar10 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
        ;
        pcVar16 = "int Abc_LitNotCond(int, int)";
LAB_00576eb7:
        __assert_fail(__assertion,pcVar10,0x132,pcVar16);
      }
      pGVar4 = pGVar4 + iVar27;
      pGVar4->Value = uVar13 | (*(uint *)pGVar4 >> 0x1e & 1) == 0;
      iVar7 = iVar7 + 1;
      iVar27 = p->nRegs;
    } while (iVar7 < iVar27);
  }
  Gia_ManHashStart(p_00);
  if (pCex->iFrame < iFrEnd) {
LAB_00576dc2:
    Gia_ManHashStop(p_00);
    if (uVar23 != pCex->nBits) {
      __assert_fail("iBit == pCex->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                    ,0x1b8,
                    "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                   );
    }
    uVar13 = pCex->iPo;
    iVar27 = p->vCos->nSize;
    if (iVar27 - p->nRegs <= (int)uVar13) {
      __assert_fail("v < Gia_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
    }
    if ((-1 < (int)uVar13) && ((int)uVar13 < iVar27)) {
      iVar27 = p->vCos->pArray[uVar13];
      if ((-1 < (long)iVar27) && (iVar27 < p->nObjs)) {
        Gia_ManAppendCo(p_00,p->pObjs[iVar27].Value);
        pGVar12 = Gia_ManCleanup(p_00);
        Gia_ManStop(p_00);
        return pGVar12;
      }
LAB_00576e45:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
LAB_00576e64:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  do {
    pVVar15 = p->vCis;
    uVar25 = (ulong)(uint)pVVar15->nSize;
    if (p->nRegs < pVVar15->nSize) {
      lVar22 = 0;
      do {
        if ((int)uVar25 <= lVar22) goto LAB_00576e64;
        lVar26 = (long)pVVar15->pArray[lVar22];
        if ((lVar26 < 0) || (p->nObjs <= pVVar15->pArray[lVar22])) goto LAB_00576e45;
        pGVar4 = p->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        *(ulong *)(pGVar4 + lVar26) =
             *(ulong *)(pGVar4 + lVar26) & 0xffffffffbfffffff |
             (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)uVar23 + lVar22) >> 5] >>
                      ((byte)((ulong)uVar23 + lVar22) & 0x1f) & 1) << 0x1e);
        lVar22 = lVar22 + 1;
        pVVar15 = p->vCis;
        uVar25 = (ulong)pVVar15->nSize;
      } while (lVar22 < (long)(uVar25 - (long)p->nRegs));
      uVar23 = uVar23 + (int)lVar22;
    }
    if (0 < p->nObjs) {
      lVar26 = 8;
      lVar22 = 0;
      do {
        pGVar4 = p->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        uVar25 = *(ulong *)((long)pGVar4 + lVar26 + -8);
        uVar13 = (uint)uVar25;
        if ((uVar25 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
          uVar17 = (uint)(uVar25 >> 0x1d) & 7 ^
                   *(uint *)((long)pGVar4 +
                            (ulong)(uint)((int)(uVar25 & 0x1fffffff) << 2) * -3 + lVar26 + -8) >>
                   0x1e;
          uVar21 = (uint)(uVar25 >> 0x1e);
          uVar19 = *(uint *)((long)pGVar4 + (ulong)(uVar21 & 0x7ffffffc) * -3 + lVar26 + -8) >> 0x1e
                   & 1;
          uVar18 = (uint)(uVar25 >> 0x3d) & 1;
          uVar24 = (uVar19 ^ uVar18) & uVar17;
          *(ulong *)((long)pGVar4 + lVar26 + -8) =
               uVar25 & 0xffffffff3fffffff | (ulong)(uVar24 << 0x1e);
          if (uVar24 == 0) {
            if (((uVar17 & 1) == 0) && (uVar19 == uVar18)) {
              iVar27 = Gia_ManHashOr(p_00,*(int *)((long)pGVar4 +
                                                  lVar26 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3)
                                     ,*(int *)((long)pGVar4 +
                                              lVar26 + (ulong)(uVar21 & 0x7ffffffc) * -3));
            }
            else {
              if ((uVar17 & 1) == 0) {
                uVar21 = (uVar13 & 0x1fffffff) << 2;
              }
              else {
                if (uVar19 != uVar18) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                                ,0x1a6,
                                "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                               );
                }
                uVar21 = uVar21 & 0x7ffffffc;
              }
              iVar27 = *(int *)((long)pGVar4 + lVar26 + (ulong)uVar21 * -3);
            }
          }
          else {
            iVar27 = Gia_ManHashAnd(p_00,*(int *)((long)pGVar4 +
                                                 lVar26 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3),
                                    *(int *)((long)pGVar4 +
                                            lVar26 + (ulong)(uVar21 & 0x7ffffffc) * -3));
          }
          *(int *)(&pGVar4->field_0x0 + lVar26) = iVar27;
          if (iVar27 == 0) {
            __assert_fail("pObj->Value > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                          ,0x1a7,
                          "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                         );
          }
        }
        lVar22 = lVar22 + 1;
        lVar26 = lVar26 + 0xc;
      } while (lVar22 < p->nObjs);
    }
    pVVar15 = p->vCos;
    if (0 < pVVar15->nSize) {
      lVar22 = 0;
      do {
        iVar27 = pVVar15->pArray[lVar22];
        if (((long)iVar27 < 0) || (p->nObjs <= iVar27)) goto LAB_00576e45;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = p->pObjs + iVar27;
        uVar13 = (uint)*(ulong *)pGVar4;
        uVar25 = (ulong)(uVar13 & 0x1fffffff);
        *(ulong *)pGVar4 =
             *(ulong *)pGVar4 & 0xffffffffbfffffff |
             (ulong)((uVar13 * 2 ^ *(uint *)(pGVar4 + -uVar25)) & 0x40000000);
        uVar13 = pGVar4[-uVar25].Value;
        pGVar4->Value = uVar13;
        if (uVar13 == 0) {
          __assert_fail("pObj->Value > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                        ,0x1ad,
                        "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                       );
        }
        lVar22 = lVar22 + 1;
        pVVar15 = p->vCos;
      } while (lVar22 < pVVar15->nSize);
    }
    if (iFrEnd == pCex->iFrame) goto LAB_00576dc2;
    iVar27 = p->nRegs;
    if (0 < iVar27) {
      iVar7 = 0;
      do {
        iVar14 = p->vCos->nSize;
        uVar13 = (iVar14 - iVar27) + iVar7;
        if (((int)uVar13 < 0) || (iVar14 <= (int)uVar13)) goto LAB_00576e64;
        iVar14 = p->vCos->pArray[uVar13];
        if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00576e45;
        pGVar4 = p->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        iVar2 = p->vCis->nSize;
        uVar13 = (iVar2 - iVar27) + iVar7;
        if (((int)uVar13 < 0) || (iVar2 <= (int)uVar13)) goto LAB_00576e64;
        iVar27 = p->vCis->pArray[uVar13];
        lVar22 = (long)iVar27;
        if ((lVar22 < 0) || (p->nObjs <= iVar27)) goto LAB_00576e45;
        *(ulong *)(pGVar4 + lVar22) =
             *(ulong *)(pGVar4 + lVar22) & 0xffffffffbfffffff |
             (ulong)((uint)*(undefined8 *)(pGVar4 + iVar14) & 0x40000000);
        pGVar4[lVar22].Value = pGVar4[iVar14].Value;
        iVar7 = iVar7 + 1;
        iVar27 = p->nRegs;
      } while (iVar7 < iVar27);
    }
    bVar6 = pCex->iFrame <= iFrEnd;
    iFrEnd = iFrEnd + 1;
    if (bVar6) goto LAB_00576dc2;
  } while( true );
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaAllOne( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k, iBit = 0, fCompl0, fCompl1;

    // skip trough the first iFrEnd frames
    Gia_ManCleanMark0(p);
    Gia_ManForEachRo( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    for ( i = 0; i < iFrEnd; i++ )
    {
        // remember values in frame iFrBeg
        if ( i == iFrBeg )
            Gia_ManForEachRo( p, pObjRo, k )
                if ( pObjRo->fMark0 )
                    Vec_BitWriteEntry( *pvInits, k, 1 );
        // simulate other values
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( i == iFrEnd );

    // create new AIG manager
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 1;
    Gia_ManForEachPi( p, pObj, k )
        pObj->Value = 1;
    Gia_ManForEachRo( p, pObjRo, k )
        pObjRo->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), !pObjRo->fMark0 );
    Gia_ManHashStart( pNew );
    for ( i = iFrEnd; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 && !fCompl1 )
                pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( !fCompl1 )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
            assert( pObj->Value > 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
            assert( pObj->Value > 0 );
        } 
        if ( i == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->Value = pObjRi->Value;
        }
    }
    Gia_ManHashStop( pNew );
    assert( iBit == pCex->nBits );

    // create PO
    Gia_ManAppendCo( pNew, Gia_ManPo(p, pCex->iPo)->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}